

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O0

int cuddZddSymmSiftingAux(DdManager *table,int x,int x_low,int x_high)

{
  uint uVar1;
  uint uVar2;
  DdNode *pDVar3;
  Move *pMVar4;
  int iVar5;
  int iVar6;
  int final_group_size;
  int init_group_size;
  int topbot;
  int i;
  int result;
  int initial_size;
  Move *move_down;
  Move *move_up;
  Move *move;
  int x_high_local;
  int x_low_local;
  int x_local;
  DdManager *table_local;
  
  uVar1 = table->keysZ;
  _result = (DdNode *)0x0;
  move_down = (Move *)0x0;
  init_group_size = x;
  while ((iVar6 = x, x_low < init_group_size &&
         (iVar5 = cuddZddSymmCheck(table,init_group_size + -1,init_group_size), iVar6 = x,
         iVar5 != 0))) {
    uVar2 = table->subtableZ[init_group_size + -1].next;
    table->subtableZ[init_group_size + -1].next = init_group_size;
    table->subtableZ[x].next = uVar2;
    init_group_size = uVar2;
  }
  while ((init_group_size = iVar6, init_group_size < x_high &&
         (iVar6 = cuddZddSymmCheck(table,init_group_size,init_group_size + 1), iVar6 != 0))) {
    for (final_group_size = init_group_size + 1;
        (uint)final_group_size < table->subtableZ[final_group_size].next;
        final_group_size = table->subtableZ[final_group_size].next) {
    }
    table->subtableZ[final_group_size].next = table->subtableZ[init_group_size].next;
    table->subtableZ[init_group_size].next = init_group_size + 1;
    iVar6 = final_group_size;
  }
  x_high_local = x;
  if (x == x_low) {
    for (; (uint)x_high_local < table->subtableZ[x_high_local].next;
        x_high_local = table->subtableZ[x_high_local].next) {
    }
    iVar6 = x_high_local - table->subtableZ[x_high_local].next;
    _result = (DdNode *)cuddZddSymmSifting_down(table,x_high_local,x_high,uVar1);
    if (_result == (DdNode *)0x1) goto LAB_00c11e37;
    if ((_result == (DdNode *)0x0) || (table->subtableZ[_result->ref].next != _result->ref)) {
      if (_result == (DdNode *)0x0) {
        x_high_local = table->subtableZ[x_high_local].next;
      }
      else {
        x_high_local = _result->ref;
      }
      for (init_group_size = x_high_local;
          (uint)init_group_size < table->subtableZ[init_group_size].next;
          init_group_size = table->subtableZ[init_group_size].next) {
      }
      if (iVar6 + 1 == (init_group_size - x_high_local) + 1) {
        iVar6 = cuddZddSymmSiftingBackward(table,(Move *)_result,uVar1);
      }
      else {
        uVar1 = table->keysZ;
        move_down = cuddZddSymmSifting_up(table,x_high_local,x_low,uVar1);
        iVar6 = cuddZddSymmSiftingBackward(table,move_down,uVar1);
      }
    }
    else {
      iVar6 = cuddZddSymmSiftingBackward(table,(Move *)_result,uVar1);
    }
  }
  else if (x == x_high) {
    for (; (uint)x_high_local < table->subtableZ[x_high_local].next;
        x_high_local = table->subtableZ[x_high_local].next) {
    }
    x_high_local = table->subtableZ[x_high_local].next;
    for (init_group_size = x_high_local;
        (uint)init_group_size < table->subtableZ[init_group_size].next;
        init_group_size = table->subtableZ[init_group_size].next) {
    }
    iVar6 = init_group_size - x_high_local;
    move_down = cuddZddSymmSifting_up(table,x_high_local,x_low,uVar1);
    if (move_down == (Move *)0x1) goto LAB_00c11e37;
    if ((move_down == (Move *)0x0) || (table->subtableZ[move_down->x].next != move_down->x)) {
      if (move_down == (Move *)0x0) {
        for (; (uint)x_high_local < table->subtableZ[x_high_local].next;
            x_high_local = table->subtableZ[x_high_local].next) {
        }
      }
      else {
        x_high_local = move_down->x;
      }
      if (iVar6 + 1 == (x_high_local - table->subtableZ[x_high_local].next) + 1) {
        iVar6 = cuddZddSymmSiftingBackward(table,move_down,uVar1);
      }
      else {
        uVar1 = table->keysZ;
        _result = (DdNode *)cuddZddSymmSifting_down(table,x_high_local,x_high,uVar1);
        iVar6 = cuddZddSymmSiftingBackward(table,(Move *)_result,uVar1);
      }
    }
    else {
      iVar6 = cuddZddSymmSiftingBackward(table,move_down,uVar1);
    }
  }
  else if (x_high - x < x - x_low) {
    for (; (uint)x_high_local < table->subtableZ[x_high_local].next;
        x_high_local = table->subtableZ[x_high_local].next) {
    }
    _result = (DdNode *)cuddZddSymmSifting_down(table,x_high_local,x_high,uVar1);
    if (_result == (DdNode *)0x1) goto LAB_00c11e37;
    if (_result == (DdNode *)0x0) {
      x_high_local = table->subtableZ[x_high_local].next;
    }
    else {
      x_high_local = _result->ref;
    }
    for (init_group_size = x_high_local;
        (uint)init_group_size < table->subtableZ[init_group_size].next;
        init_group_size = table->subtableZ[init_group_size].next) {
    }
    iVar6 = init_group_size - x_high_local;
    move_down = cuddZddSymmSifting_up(table,x_high_local,x_low,uVar1);
    if (move_down == (Move *)0x1) goto LAB_00c11e37;
    if ((move_down == (Move *)0x0) || (table->subtableZ[move_down->x].next != move_down->x)) {
      if (move_down == (Move *)0x0) {
        for (; (uint)x_high_local < table->subtableZ[x_high_local].next;
            x_high_local = table->subtableZ[x_high_local].next) {
        }
      }
      else {
        x_high_local = move_down->x;
      }
      if (iVar6 + 1 == (x_high_local - table->subtableZ[x_high_local].next) + 1) {
        iVar6 = cuddZddSymmSiftingBackward(table,move_down,uVar1);
      }
      else {
        while (_result != (DdNode *)0x0) {
          pDVar3 = (_result->type).kids.T;
          _result->ref = 0;
          _result->next = table->nextFree;
          table->nextFree = _result;
          _result = pDVar3;
        }
        uVar1 = table->keysZ;
        _result = (DdNode *)cuddZddSymmSifting_down(table,x_high_local,x_high,uVar1);
        iVar6 = cuddZddSymmSiftingBackward(table,(Move *)_result,uVar1);
      }
    }
    else {
      iVar6 = cuddZddSymmSiftingBackward(table,move_down,uVar1);
    }
  }
  else {
    for (; (uint)x_high_local < table->subtableZ[x_high_local].next;
        x_high_local = table->subtableZ[x_high_local].next) {
    }
    x_high_local = table->subtableZ[x_high_local].next;
    move_down = cuddZddSymmSifting_up(table,x_high_local,x_low,uVar1);
    if (move_down == (Move *)0x1) goto LAB_00c11e37;
    if (move_down == (Move *)0x0) {
      for (; (uint)x_high_local < table->subtableZ[x_high_local].next;
          x_high_local = table->subtableZ[x_high_local].next) {
      }
    }
    else {
      x_high_local = move_down->x;
    }
    iVar6 = x_high_local - table->subtableZ[x_high_local].next;
    _result = (DdNode *)cuddZddSymmSifting_down(table,x_high_local,x_high,uVar1);
    if (_result == (DdNode *)0x1) goto LAB_00c11e37;
    if ((_result == (DdNode *)0x0) || (table->subtableZ[_result->ref].next != _result->ref)) {
      if (_result == (DdNode *)0x0) {
        x_high_local = table->subtableZ[x_high_local].next;
      }
      else {
        x_high_local = _result->ref;
      }
      for (init_group_size = x_high_local;
          (uint)init_group_size < table->subtableZ[init_group_size].next;
          init_group_size = table->subtableZ[init_group_size].next) {
      }
      if (iVar6 + 1 == (init_group_size - x_high_local) + 1) {
        iVar6 = cuddZddSymmSiftingBackward(table,(Move *)_result,uVar1);
      }
      else {
        while (move_down != (Move *)0x0) {
          pMVar4 = move_down->next;
          move_down->y = 0;
          *(DdNode **)&move_down->flags = table->nextFree;
          table->nextFree = (DdNode *)move_down;
          move_down = pMVar4;
        }
        uVar1 = table->keysZ;
        move_down = cuddZddSymmSifting_up(table,x_high_local,x_low,uVar1);
        iVar6 = cuddZddSymmSiftingBackward(table,move_down,uVar1);
      }
    }
    else {
      iVar6 = cuddZddSymmSiftingBackward(table,(Move *)_result,uVar1);
    }
  }
  if (iVar6 != 0) {
    while (_result != (DdNode *)0x0) {
      pDVar3 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar3;
    }
    while (move_down != (Move *)0x0) {
      pMVar4 = move_down->next;
      move_down->y = 0;
      *(DdNode **)&move_down->flags = table->nextFree;
      table->nextFree = (DdNode *)move_down;
      move_down = pMVar4;
    }
    return 1;
  }
LAB_00c11e37:
  if (_result != (DdNode *)0x1) {
    while (_result != (DdNode *)0x0) {
      pDVar3 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar3;
    }
  }
  if (move_down != (Move *)0x1) {
    while (move_down != (Move *)0x0) {
      pMVar4 = move_down->next;
      move_down->y = 0;
      *(DdNode **)&move_down->flags = table->nextFree;
      table->nextFree = (DdNode *)move_down;
      move_down = pMVar4;
    }
  }
  return 0;
}

Assistant:

static int
cuddZddSymmSiftingAux(
  DdManager * table,
  int  x,
  int  x_low,
  int  x_high)
{
    Move *move;
    Move *move_up;      /* list of up move */
    Move *move_down;    /* list of down move */
    int  initial_size;
    int  result;
    int  i;
    int  topbot;        /* index to either top or bottom of symmetry group */
    int  init_group_size, final_group_size;

    initial_size = table->keysZ;

    move_down = NULL;
    move_up = NULL;

    /* Look for consecutive symmetries above x. */
    for (i = x; i > x_low; i--) {
        if (!cuddZddSymmCheck(table, i - 1, i))
            break;
        /* find top of i-1's symmetry */
        topbot = table->subtableZ[i - 1].next;
        table->subtableZ[i - 1].next = i;
        table->subtableZ[x].next = topbot;
        /* x is bottom of group so its symmetry is top of i-1's
           group */
        i = topbot + 1; /* add 1 for i--, new i is top of symm group */
    }
    /* Look for consecutive symmetries below x. */
    for (i = x; i < x_high; i++) {
        if (!cuddZddSymmCheck(table, i, i + 1))
            break;
        /* find bottom of i+1's symm group */
        topbot = i + 1;
        while ((unsigned) topbot < table->subtableZ[topbot].next)
            topbot = table->subtableZ[topbot].next;

        table->subtableZ[topbot].next = table->subtableZ[i].next;
        table->subtableZ[i].next = i + 1;
        i = topbot - 1; /* add 1 for i++,
                           new i is bottom of symm group */
    }

    /* Now x maybe in the middle of a symmetry group. */
    if (x == x_low) { /* Sift down */
        /* Find bottom of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;

        i = table->subtableZ[x].next;
        init_group_size = x - i + 1;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down == NULL ||
            table->subtableZ[move_down->y].next != move_down->y) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_down != NULL)
                x = move_down->y;
            else
                x = table->subtableZ[x].next;
            i = x;
            while ((unsigned) i < table->subtableZ[i].next) {
                i = table->subtableZ[i].next;
            }
            final_group_size = i - x + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table,
                    move_down, initial_size);
            }
            else {
                initial_size = table->keysZ;
                move_up = cuddZddSymmSifting_up(table, x, x_low,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_down,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else if (x == x_high) { /* Sift up */
        /* Find top of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
        x = table->subtableZ[x].next;

        i = x;
        while ((unsigned) i < table->subtableZ[i].next) {
            i = table->subtableZ[i].next;
        }
        init_group_size = i - x + 1;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        /* after that point x --> x_low, unless early term */
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up == NULL ||
            table->subtableZ[move_up->x].next != move_up->x) {
            /* symmetry detected may have to make another complete
                pass */
            if (move_up != NULL)
                x = move_up->x;
            else {
                while ((unsigned) x < table->subtableZ[x].next)
                    x = table->subtableZ[x].next;
            }
            i = table->subtableZ[x].next;
            final_group_size = x - i + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
            else {
                initial_size = table->keysZ;
                move_down = cuddZddSymmSifting_down(table, x, x_high,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_up,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else if ((x - x_low) > (x_high - x)) { /* must go down first:
                                                shorter */
        /* Find bottom of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down != NULL) {
            x = move_down->y;
        }
        else {
            x = table->subtableZ[x].next;
        }
        i = x;
        while ((unsigned) i < table->subtableZ[i].next) {
            i = table->subtableZ[i].next;
        }
        init_group_size = i - x + 1;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up == NULL ||
            table->subtableZ[move_up->x].next != move_up->x) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_up != NULL) {
                x = move_up->x;
            }
            else {
                while ((unsigned) x < table->subtableZ[x].next)
                    x = table->subtableZ[x].next;
            }
            i = table->subtableZ[x].next;
            final_group_size = x - i + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
            else {
                while (move_down != NULL) {
                    move = move_down->next;
                    cuddDeallocMove(table, move_down);
                    move_down = move;
                }
                initial_size = table->keysZ;
                move_down = cuddZddSymmSifting_down(table, x, x_high,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_up,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else { /* moving up first:shorter */
        /* Find top of x's symmetry group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
        x = table->subtableZ[x].next;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up != NULL) {
            x = move_up->x;
        }
        else {
            while ((unsigned) x < table->subtableZ[x].next)
                x = table->subtableZ[x].next;
        }
        i = table->subtableZ[x].next;
        init_group_size = x - i + 1;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down == NULL ||
            table->subtableZ[move_down->y].next != move_down->y) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_down != NULL) {
                x = move_down->y;
            }
            else {
                x = table->subtableZ[x].next;
            }
            i = x;
            while ((unsigned) i < table->subtableZ[i].next) {
                i = table->subtableZ[i].next;
            }
            final_group_size = i - x + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetries detected,
                   go back to best position */
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
            else {
                while (move_up != NULL) {
                    move = move_up->next;
                    cuddDeallocMove(table, move_up);
                    move_up = move;
                }
                initial_size = table->keysZ;
                move_up = cuddZddSymmSifting_up(table, x, x_low,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_down,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }

    while (move_down != NULL) {
        move = move_down->next;
        cuddDeallocMove(table, move_down);
        move_down = move;
    }
    while (move_up != NULL) {
        move = move_up->next;
        cuddDeallocMove(table, move_up);
        move_up = move;
    }

    return(1);

cuddZddSymmSiftingAuxOutOfMem:
    if (move_down != ZDD_MV_OOM) {
        while (move_down != NULL) {
            move = move_down->next;
            cuddDeallocMove(table, move_down);
            move_down = move;
        }
    }
    if (move_up != ZDD_MV_OOM) {
        while (move_up != NULL) {
            move = move_up->next;
            cuddDeallocMove(table, move_up);
            move_up = move;
        }
    }

    return(0);

}